

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::load_fromPostsolve(HModel *this,HPresolve *ptr_model)

{
  HModel *in_RSI;
  HPresolve *in_RDI;
  HModel *unaff_retaddr;
  
  clearModel(in_RSI);
  copy_fromHPresolveToHModel(in_RSI,in_RDI);
  initScale(unaff_retaddr);
  copy_basisFromPostsolve(in_RSI,in_RDI);
  initFromNonbasic(in_RSI);
  check_load_fromPostsolve(in_RSI);
  return;
}

Assistant:

void HModel::load_fromPostsolve(HPresolve & ptr_model) {
  clearModel();
  copy_fromHPresolveToHModel(ptr_model);
  initScale();
  copy_basisFromPostsolve(ptr_model);
  initFromNonbasic();
#ifdef JAJH_dev
  check_load_fromPostsolve();
#endif
}